

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,java *this,FieldDescriptor *field,bool immutable,
          ClassNameResolver *name_resolver)

{
  float fVar1;
  double dVar2;
  ClassNameResolver *this_00;
  bool bVar3;
  CppType CVar4;
  uint uVar5;
  uint32 uVar6;
  Type TVar7;
  protobuf *ppVar8;
  char *pcVar9;
  string *psVar10;
  EnumDescriptor *descriptor;
  EnumValueDescriptor *this_01;
  Descriptor *descriptor_00;
  LogMessage *other;
  undefined7 in_register_00000009;
  int i;
  int i_00;
  long i_01;
  long i_02;
  float fVar11;
  float fVar12;
  double dVar13;
  double dVar14;
  SubstituteArg *in_stack_fffffffffffff938;
  allocator local_5ba;
  LogFinisher local_5b9;
  LogMessage local_5b8;
  string local_580;
  string local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  SubstituteArg local_520;
  SubstituteArg local_4f0;
  SubstituteArg local_4c0;
  SubstituteArg local_490;
  SubstituteArg local_460;
  SubstituteArg local_430;
  SubstituteArg local_400;
  SubstituteArg local_3d0;
  SubstituteArg local_3a0;
  string local_370;
  SubstituteArg local_350;
  string local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  allocator local_2d9;
  SubstituteArg local_2d8;
  SubstituteArg local_2a8;
  SubstituteArg local_278;
  SubstituteArg local_248;
  SubstituteArg local_218;
  SubstituteArg local_1e8;
  SubstituteArg local_1b8;
  SubstituteArg local_188;
  SubstituteArg local_158;
  string local_128;
  SubstituteArg local_108;
  allocator local_d1;
  string local_d0;
  allocator local_af;
  allocator local_ae;
  allocator local_ad;
  float local_ac;
  undefined1 local_a8 [4];
  float value_1;
  allocator local_83;
  allocator local_82;
  allocator local_81;
  double local_80;
  double value;
  string local_48;
  ClassNameResolver *local_28;
  ClassNameResolver *name_resolver_local;
  java *pjStack_18;
  bool immutable_local;
  FieldDescriptor *field_local;
  
  local_28 = (ClassNameResolver *)CONCAT71(in_register_00000009,immutable);
  name_resolver_local._7_1_ = (byte)field & 1;
  pjStack_18 = this;
  field_local = (FieldDescriptor *)__return_storage_ptr__;
  CVar4 = FieldDescriptor::cpp_type((FieldDescriptor *)this);
  this_00 = local_28;
  switch(CVar4) {
  case CPPTYPE_INT32:
    uVar5 = FieldDescriptor::default_value_int32((FieldDescriptor *)pjStack_18);
    SimpleItoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)(ulong)uVar5,i);
    break;
  case CPPTYPE_INT64:
    ppVar8 = (protobuf *)FieldDescriptor::default_value_int64((FieldDescriptor *)pjStack_18);
    SimpleItoa_abi_cxx11_(&local_48,ppVar8,i_01);
    std::operator+(__return_storage_ptr__,&local_48,"L");
    std::__cxx11::string::~string((string *)&local_48);
    break;
  case CPPTYPE_UINT32:
    uVar6 = FieldDescriptor::default_value_uint32((FieldDescriptor *)pjStack_18);
    SimpleItoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)(ulong)uVar6,i_00);
    break;
  case CPPTYPE_UINT64:
    ppVar8 = (protobuf *)FieldDescriptor::default_value_uint64((FieldDescriptor *)pjStack_18);
    SimpleItoa_abi_cxx11_((string *)&value,ppVar8,i_02);
    std::operator+(__return_storage_ptr__,(string *)&value,"L");
    std::__cxx11::string::~string((string *)&value);
    break;
  case CPPTYPE_DOUBLE:
    dVar13 = FieldDescriptor::default_value_double((FieldDescriptor *)pjStack_18);
    local_80 = dVar13;
    dVar14 = std::numeric_limits<double>::infinity();
    dVar2 = local_80;
    if ((dVar13 != dVar14) || (NAN(dVar13) || NAN(dVar14))) {
      dVar13 = std::numeric_limits<double>::infinity();
      if ((dVar2 != -dVar13) || (NAN(dVar2) || NAN(-dVar13))) {
        if (NAN(local_80)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)__return_storage_ptr__,"Double.NaN",&local_83);
          std::allocator<char>::~allocator((allocator<char> *)&local_83);
        }
        else {
          SimpleDtoa_abi_cxx11_((string *)local_a8,(protobuf *)this,local_80);
          std::operator+(__return_storage_ptr__,(string *)local_a8,"D");
          std::__cxx11::string::~string((string *)local_a8);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,"Double.NEGATIVE_INFINITY",&local_82);
        std::allocator<char>::~allocator((allocator<char> *)&local_82);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"Double.POSITIVE_INFINITY",&local_81);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
    }
    break;
  case CPPTYPE_FLOAT:
    fVar11 = FieldDescriptor::default_value_float((FieldDescriptor *)pjStack_18);
    local_ac = fVar11;
    fVar12 = std::numeric_limits<float>::infinity();
    fVar1 = local_ac;
    if ((fVar11 != fVar12) || (NAN(fVar11) || NAN(fVar12))) {
      fVar11 = std::numeric_limits<float>::infinity();
      if ((fVar1 != -fVar11) || (NAN(fVar1) || NAN(-fVar11))) {
        if (NAN(local_ac)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)__return_storage_ptr__,"Float.NaN",&local_af);
          std::allocator<char>::~allocator((allocator<char> *)&local_af);
        }
        else {
          SimpleFtoa_abi_cxx11_(&local_d0,(protobuf *)this,local_ac);
          std::operator+(__return_storage_ptr__,&local_d0,"F");
          std::__cxx11::string::~string((string *)&local_d0);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,"Float.NEGATIVE_INFINITY",&local_ae);
        std::allocator<char>::~allocator((allocator<char> *)&local_ae);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"Float.POSITIVE_INFINITY",&local_ad);
      std::allocator<char>::~allocator((allocator<char> *)&local_ad);
    }
    break;
  case CPPTYPE_BOOL:
    bVar3 = FieldDescriptor::default_value_bool((FieldDescriptor *)pjStack_18);
    pcVar9 = "false";
    if (bVar3) {
      pcVar9 = "true";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar9,&local_d1);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    break;
  case CPPTYPE_ENUM:
    descriptor = FieldDescriptor::enum_type((FieldDescriptor *)pjStack_18);
    ClassNameResolver::GetClassName_abi_cxx11_
              (&local_560,this_00,descriptor,(bool)(name_resolver_local._7_1_ & 1));
    std::operator+(&local_540,&local_560,".");
    this_01 = FieldDescriptor::default_value_enum((FieldDescriptor *)pjStack_18);
    psVar10 = EnumValueDescriptor::name_abi_cxx11_(this_01);
    std::operator+(__return_storage_ptr__,&local_540,psVar10);
    std::__cxx11::string::~string((string *)&local_540);
    std::__cxx11::string::~string((string *)&local_560);
    break;
  case CPPTYPE_STRING:
    TVar7 = GetType((FieldDescriptor *)pjStack_18);
    if (TVar7 == TYPE_BYTES) {
      bVar3 = FieldDescriptor::has_default_value((FieldDescriptor *)pjStack_18);
      if (bVar3) {
        psVar10 = FieldDescriptor::default_value_string_abi_cxx11_((FieldDescriptor *)pjStack_18);
        CEscape(&local_128,psVar10);
        strings::internal::SubstituteArg::SubstituteArg(&local_108,&local_128);
        strings::internal::SubstituteArg::SubstituteArg(&local_158);
        strings::internal::SubstituteArg::SubstituteArg(&local_188);
        strings::internal::SubstituteArg::SubstituteArg(&local_1b8);
        strings::internal::SubstituteArg::SubstituteArg(&local_1e8);
        strings::internal::SubstituteArg::SubstituteArg(&local_218);
        strings::internal::SubstituteArg::SubstituteArg(&local_248);
        strings::internal::SubstituteArg::SubstituteArg(&local_278);
        strings::internal::SubstituteArg::SubstituteArg(&local_2a8);
        strings::internal::SubstituteArg::SubstituteArg(&local_2d8);
        strings::Substitute_abi_cxx11_
                  (__return_storage_ptr__,
                   (strings *)"com.google.protobuf.Internal.bytesDefaultValue(\"$0\")",
                   (char *)&local_108,&local_158,&local_188,&local_1b8,&local_1e8,&local_218,
                   &local_248,&local_278,&local_2a8,&local_2d8,in_stack_fffffffffffff938);
        std::__cxx11::string::~string((string *)&local_128);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,"com.google.protobuf.ByteString.EMPTY",
                   &local_2d9);
        std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
      }
    }
    else {
      psVar10 = FieldDescriptor::default_value_string_abi_cxx11_((FieldDescriptor *)pjStack_18);
      bVar3 = AllAscii(psVar10);
      if (bVar3) {
        psVar10 = FieldDescriptor::default_value_string_abi_cxx11_((FieldDescriptor *)pjStack_18);
        CEscape(&local_320,psVar10);
        std::operator+(&local_300,"\"",&local_320);
        std::operator+(__return_storage_ptr__,&local_300,"\"");
        std::__cxx11::string::~string((string *)&local_300);
        std::__cxx11::string::~string((string *)&local_320);
      }
      else {
        psVar10 = FieldDescriptor::default_value_string_abi_cxx11_((FieldDescriptor *)pjStack_18);
        CEscape(&local_370,psVar10);
        strings::internal::SubstituteArg::SubstituteArg(&local_350,&local_370);
        strings::internal::SubstituteArg::SubstituteArg(&local_3a0);
        strings::internal::SubstituteArg::SubstituteArg(&local_3d0);
        strings::internal::SubstituteArg::SubstituteArg(&local_400);
        strings::internal::SubstituteArg::SubstituteArg(&local_430);
        strings::internal::SubstituteArg::SubstituteArg(&local_460);
        strings::internal::SubstituteArg::SubstituteArg(&local_490);
        strings::internal::SubstituteArg::SubstituteArg(&local_4c0);
        strings::internal::SubstituteArg::SubstituteArg(&local_4f0);
        strings::internal::SubstituteArg::SubstituteArg(&local_520);
        strings::Substitute_abi_cxx11_
                  (__return_storage_ptr__,
                   (strings *)"com.google.protobuf.Internal.stringDefaultValue(\"$0\")",
                   (char *)&local_350,&local_3a0,&local_3d0,&local_400,&local_430,&local_460,
                   &local_490,&local_4c0,&local_4f0,&local_520,in_stack_fffffffffffff938);
        std::__cxx11::string::~string((string *)&local_370);
      }
    }
    break;
  case CPPTYPE_MESSAGE:
    descriptor_00 = FieldDescriptor::message_type((FieldDescriptor *)pjStack_18);
    ClassNameResolver::GetClassName_abi_cxx11_
              (&local_580,this_00,descriptor_00,(bool)(name_resolver_local._7_1_ & 1));
    std::operator+(__return_storage_ptr__,&local_580,".getDefaultInstance()");
    std::__cxx11::string::~string((string *)&local_580);
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_5b8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_helpers.cc"
               ,0x1df);
    other = internal::LogMessage::operator<<(&local_5b8,"Can\'t get here.");
    internal::LogFinisher::operator=(&local_5b9,other);
    internal::LogMessage::~LogMessage(&local_5b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_5ba);
    std::allocator<char>::~allocator((allocator<char> *)&local_5ba);
  }
  return __return_storage_ptr__;
}

Assistant:

string DefaultValue(const FieldDescriptor* field, bool immutable,
                    ClassNameResolver* name_resolver) {
  // Switch on CppType since we need to know which default_value_* method
  // of FieldDescriptor to call.
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return SimpleItoa(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_UINT32:
      // Need to print as a signed int since Java has no unsigned.
      return SimpleItoa(static_cast<int32>(field->default_value_uint32()));
    case FieldDescriptor::CPPTYPE_INT64:
      return SimpleItoa(field->default_value_int64()) + "L";
    case FieldDescriptor::CPPTYPE_UINT64:
      return SimpleItoa(static_cast<int64>(field->default_value_uint64())) +
             "L";
    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value = field->default_value_double();
      if (value == std::numeric_limits<double>::infinity()) {
        return "Double.POSITIVE_INFINITY";
      } else if (value == -std::numeric_limits<double>::infinity()) {
        return "Double.NEGATIVE_INFINITY";
      } else if (value != value) {
        return "Double.NaN";
      } else {
        return SimpleDtoa(value) + "D";
      }
    }
    case FieldDescriptor::CPPTYPE_FLOAT: {
      float value = field->default_value_float();
      if (value == std::numeric_limits<float>::infinity()) {
        return "Float.POSITIVE_INFINITY";
      } else if (value == -std::numeric_limits<float>::infinity()) {
        return "Float.NEGATIVE_INFINITY";
      } else if (value != value) {
        return "Float.NaN";
      } else {
        return SimpleFtoa(value) + "F";
      }
    }
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "true" : "false";
    case FieldDescriptor::CPPTYPE_STRING:
      if (GetType(field) == FieldDescriptor::TYPE_BYTES) {
        if (field->has_default_value()) {
          // See comments in Internal.java for gory details.
          return strings::Substitute(
            "com.google.protobuf.Internal.bytesDefaultValue(\"$0\")",
            CEscape(field->default_value_string()));
        } else {
          return "com.google.protobuf.ByteString.EMPTY";
        }
      } else {
        if (AllAscii(field->default_value_string())) {
          // All chars are ASCII.  In this case CEscape() works fine.
          return "\"" + CEscape(field->default_value_string()) + "\"";
        } else {
          // See comments in Internal.java for gory details.
          return strings::Substitute(
              "com.google.protobuf.Internal.stringDefaultValue(\"$0\")",
              CEscape(field->default_value_string()));
        }
      }

    case FieldDescriptor::CPPTYPE_ENUM:
      return name_resolver->GetClassName(field->enum_type(), immutable) + "." +
          field->default_value_enum()->name();

    case FieldDescriptor::CPPTYPE_MESSAGE:
      return name_resolver->GetClassName(field->message_type(), immutable) +
          ".getDefaultInstance()";

    // No default because we want the compiler to complain if any new
    // types are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return "";
}